

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_type_info.cpp
# Opt level: O2

void __thiscall duckdb::CreateTypeInfo::CreateTypeInfo(CreateTypeInfo *this)

{
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  ::std::__cxx11::string::string((string *)&local_38,"main",&local_59);
  ::std::__cxx11::string::string((string *)&local_58,anon_var_dwarf_4b0ffdd + 9,&local_5a);
  CreateInfo::CreateInfo(&this->super_CreateInfo,TYPE_ENTRY,&local_38,&local_58);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  (this->super_CreateInfo).super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__CreateTypeInfo_027a82e0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  LogicalType::LogicalType(&this->type);
  (this->query).super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
  _M_t.super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
  super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)0x0;
  this->bind_function = (bind_logical_type_function_t)0x0;
  return;
}

Assistant:

CreateTypeInfo::CreateTypeInfo() : CreateInfo(CatalogType::TYPE_ENTRY), bind_function(nullptr) {
}